

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.cpp
# Opt level: O2

qsizetype __thiscall
QLatin1StringMatcher::indexIn_helper<QLatin1StringView>
          (QLatin1StringMatcher *this,QLatin1StringView haystack,qsizetype from)

{
  char *last;
  long lVar1;
  char *pat_first;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QLatin1StringView s;
  R_conflict10 RVar8;
  QLatin1StringView local_48;
  long local_38;
  
  pcVar4 = (char *)haystack.m_size;
  pcVar5 = haystack.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->m_pattern).m_size;
  pcVar3 = pcVar4;
  if (pcVar4 != (char *)from || lVar1 != 0) {
    lVar6 = (from >> 0x3f & (ulong)pcVar4) + from;
    pcVar3 = (char *)0xffffffffffffffff;
    if (lVar6 < (long)pcVar4) {
      pcVar7 = pcVar5 + lVar6;
      last = pcVar5 + (long)pcVar4;
      pat_first = (this->m_pattern).m_data;
      if (this->m_cs == CaseSensitive) {
        RVar8 = QtPrivate::
                q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
                              *)&(this->field_2).m_caseSensitiveSearcher,pcVar7,last,pat_first,
                             pat_first + lVar1);
        pcVar7 = RVar8.begin;
        if (pcVar7 != last) {
LAB_00161b74:
          pcVar3 = pcVar7 + -(long)pcVar5;
        }
      }
      else {
        lVar6 = 0x100;
        if (lVar1 < 0x100) {
          lVar6 = lVar1;
        }
        local_48.m_data = pcVar5;
        local_48.m_size = (qsizetype)pcVar4;
        while( true ) {
          RVar8 = QtPrivate::
                  q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                  ::operator()((q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
                                *)&(this->field_2).m_caseSensitiveSearcher,pcVar7,last,
                               this->m_foldBuffer,this->m_foldBuffer + lVar6);
          pcVar7 = RVar8.begin;
          if (pcVar7 == last) break;
          if (lVar1 - lVar6 < 1) goto LAB_00161b74;
          pcVar3 = pcVar7 + (lVar6 - (long)pcVar5);
          if ((long)pcVar4 <= (long)(pcVar7 + (lVar6 - (long)pcVar5))) {
            pcVar3 = pcVar4;
          }
          local_48.m_data = pcVar5 + (long)pcVar3;
          local_48.m_size = (qsizetype)(pcVar4 + -(long)pcVar3);
          s.m_size = lVar1 - lVar6;
          s.m_data = pat_first + lVar6;
          bVar2 = QLatin1StringView::startsWith(&local_48,s,CaseInsensitive);
          if (bVar2) goto LAB_00161b74;
          pcVar7 = pcVar7 + 1;
        }
        pcVar3 = (char *)0xffffffffffffffff;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (qsizetype)pcVar3;
}

Assistant:

qsizetype QLatin1StringMatcher::indexIn_helper(String haystack, qsizetype from) const noexcept
{
    static_assert(QtPrivate::isLatin1OrUtf16View<String>);

    if (m_pattern.isEmpty() && from == haystack.size())
        return from;
    if (from < 0) // Historical behavior (see QString::indexOf and co.)
        from += haystack.size();
    if (from >= haystack.size())
        return -1;

    const auto start = [haystack] {
        if constexpr (std::is_same_v<String, QStringView>)
            return haystack.utf16();
        else
            return haystack.begin();
    }();

    auto begin = start + from;
    auto end = start + haystack.size();
    auto found = begin;
    if (m_cs == Qt::CaseSensitive) {
        found = m_caseSensitiveSearcher(begin, end, m_pattern.begin(), m_pattern.end()).begin;
        if (found == end)
            return -1;
    } else {
        const qsizetype bufferSize = std::min(m_pattern.size(), qsizetype(sizeof m_foldBuffer));
        const QLatin1StringView restNeedle = m_pattern.sliced(bufferSize);
        const bool needleLongerThanBuffer = restNeedle.size() > 0;
        String restHaystack = haystack;
        do {
            found = m_caseInsensitiveSearcher(found, end, m_foldBuffer, &m_foldBuffer[bufferSize])
                            .begin;
            if (found == end) {
                return -1;
            } else if (!needleLongerThanBuffer) {
                break;
            }
            restHaystack = haystack.sliced(
                    qMin(haystack.size(),
                         bufferSize + qsizetype(std::distance(start, found))));
            if (restHaystack.startsWith(restNeedle, Qt::CaseInsensitive))
                break;
            ++found;
        } while (true);
    }
    return std::distance(start, found);
}